

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5SSBOArrayIndexing.cpp
# Opt level: O1

void __thiscall glcts::GPUShader5SSBOArrayIndexing::deinit(GPUShader5SSBOArrayIndexing *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0x40))(0x90d2,0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program_id = 0;
  }
  if (this->m_compute_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_compute_shader_id = 0;
  }
  if (this->m_ssbo_buffer_ids != (GLuint *)0x0) {
    (**(code **)(lVar2 + 0x438))(4);
    if (this->m_ssbo_buffer_ids != (GLuint *)0x0) {
      operator_delete__(this->m_ssbo_buffer_ids);
    }
    this->m_ssbo_buffer_ids = (GLuint *)0x0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GPUShader5SSBOArrayIndexing::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

	/* Delete program object and shaders */
	if (m_program_id != 0)
	{
		gl.deleteProgram(m_program_id);

		m_program_id = 0;
	}

	if (m_compute_shader_id != 0)
	{
		gl.deleteShader(m_compute_shader_id);

		m_compute_shader_id = 0;
	}

	if (m_ssbo_buffer_ids != DE_NULL)
	{
		gl.deleteBuffers(m_n_arrays, m_ssbo_buffer_ids);

		delete[] m_ssbo_buffer_ids;
		m_ssbo_buffer_ids = DE_NULL;
	}

	/* Call base class' deinit() */
	TestCaseBase::deinit();
}